

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Random_keys.cpp
# Opt level: O1

void __thiscall
Random_keys::cruzamento5
          (Random_keys *this,RK_Individual *pai1,RK_Individual *pai2,RK_Individual *filho)

{
  pointer ppCVar1;
  pointer __last;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  double dVar8;
  linear_congruential_engine<unsigned_long,_16807UL,_0UL,_2147483647UL> local_38;
  
  __last = RK_Individual::cromossomos.
           super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppCVar1 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = time((time_t *)0x0);
  local_38._M_x = uVar3 % 0x7fffffff + (ulong)(uVar3 % 0x7fffffff == 0);
  std::
  shuffle<__gnu_cxx::__normal_iterator<Chromosome**,std::vector<Chromosome*,std::allocator<Chromosome*>>>,std::linear_congruential_engine<unsigned_long,16807ul,0ul,2147483647ul>>
            ((__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )ppCVar1,
             (__normal_iterator<Chromosome_**,_std::vector<Chromosome_*,_std::allocator<Chromosome_*>_>_>
              )__last,&local_38);
  ppCVar1 = RK_Individual::cromossomos.
            super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar3 = (long)RK_Individual::cromossomos.
                super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)RK_Individual::cromossomos.
                super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                super__Vector_impl_data._M_start >> 3;
  dVar8 = round((double)(int)uVar3 * 0.4);
  uVar6 = (ulong)(int)dVar8;
  if ((int)dVar8 != 0) {
    uVar4 = 0;
    do {
      if (uVar3 == uVar4) goto LAB_00107a39;
      iVar2 = ppCVar1[uVar4]->position;
      filho->weights[iVar2] = pai1->weights[iVar2];
      uVar4 = uVar4 + 1;
    } while (uVar6 != uVar4);
  }
  uVar7 = uVar3 - uVar6;
  if (uVar6 < uVar7) {
    uVar5 = uVar6 * 2;
    uVar4 = uVar6;
    do {
      if (uVar3 <= uVar4) goto LAB_00107a39;
      iVar2 = ppCVar1[uVar4]->position;
      filho->weights[iVar2] = pai2->weights[iVar2];
      uVar4 = uVar4 + 1;
      uVar5 = uVar5 + 1;
    } while (uVar3 != uVar5);
  }
  while( true ) {
    uVar4 = uVar7;
    if ((ulong)((long)RK_Individual::cromossomos.
                      super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)RK_Individual::cromossomos.
                      super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                      super__Vector_impl_data._M_start >> 3) <= uVar4) {
      return;
    }
    iVar2 = rand();
    uVar3 = (long)RK_Individual::cromossomos.
                  super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                  super__Vector_impl_data._M_finish -
            (long)RK_Individual::cromossomos.
                  super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>._M_impl.
                  super__Vector_impl_data._M_start >> 3;
    if (uVar3 <= uVar4) break;
    filho->weights
    [RK_Individual::cromossomos.super__Vector_base<Chromosome_*,_std::allocator<Chromosome_*>_>.
     _M_impl.super__Vector_impl_data._M_start[uVar4]->position] = (double)(iVar2 % 100);
    uVar7 = uVar4 + 1;
  }
LAB_00107a39:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4,uVar3
            );
}

Assistant:

void Random_keys::cruzamento5(RK_Individual *pai1, RK_Individual *pai2, RK_Individual *filho) {
    shuffle(RK_Individual::cromossomos.begin(), RK_Individual::cromossomos.end(), std::default_random_engine(time(NULL)));

    int tam = RK_Individual::cromossomos.size();

    int tam04 = round(0.4*tam);

    //40% vem do pai1
    for(unsigned long int i=0; i<tam04; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai1->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //40% vem do pai12
    for(unsigned long int i=tam04; i<RK_Individual::cromossomos.size()-tam04; i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = pai2->getWeights()[RK_Individual::cromossomos.at(i)->position];

    //20% gerado de forma aleatoria
    for(unsigned long int i=RK_Individual::cromossomos.size()-tam04; i<RK_Individual::cromossomos.size(); i++)
        filho->getWeights()[RK_Individual::cromossomos.at(i)->position] = rand() % 100;

}